

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
::clear(raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
        *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->size_ != 0) {
    if (this->capacity_ != 0) {
      sVar2 = this->capacity_;
      if (sVar2 != 0) {
        sVar1 = 0;
        do {
          if (-1 < this->ctrl_[sVar1]) {
            operator_delete(this->slots_[sVar1],8);
          }
          sVar1 = sVar1 + 1;
          sVar2 = this->capacity_;
        } while (sVar1 != sVar2);
      }
      this->size_ = 0;
      memset(this->ctrl_,0x80,sVar2 + 0x10);
      this->ctrl_[sVar2] = -1;
      reset_growth_left(this,this->capacity_);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x50a,
                    "void phmap::priv::raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>::clear() [Policy = phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const { return !size(); }